

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependanceestimator.cxx
# Opt level: O2

int __thiscall DependanceEstimator::init(DependanceEstimator *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  double *pdVar2;
  double **ppdVar3;
  ulong uVar4;
  ulong uVar5;
  int i;
  int j;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  
  (this->super_Estimator).nSamples = 0;
  pdVar2 = this->aSamples;
  uVar4 = 0;
  uVar7 = (ulong)(uint)this->dependanceBins;
  if (this->dependanceBins < 1) {
    uVar7 = uVar4;
  }
  for (; uVar7 != uVar4; uVar4 = uVar4 + 1) {
    pdVar2[uVar4] = 0.0;
  }
  uVar1 = (this->super_Estimator).nEstimate;
  uVar4 = (ulong)uVar1;
  if ((uVar1 & 4) != 0) {
    pdVar2 = this->aOne;
    for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
      pdVar2[uVar5] = 0.0;
    }
  }
  if ((uVar1 & 8) != 0) {
    pdVar2 = this->aTwo;
    for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
      pdVar2[uVar5] = 0.0;
    }
  }
  if ((uVar1 & 0x10) != 0) {
    pdVar2 = this->aThree;
    for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
      pdVar2[uVar5] = 0.0;
    }
  }
  if ((uVar1 & 2) != 0) {
    dVar8 = ceil((this->dDistEnd - this->dDistBegin) / this->dDistDelta);
    uVar5 = 0;
    uVar4 = (ulong)(uint)(int)dVar8;
    if ((int)dVar8 < 1) {
      uVar4 = uVar5;
    }
    for (; uVar5 != uVar7; uVar5 = uVar5 + 1) {
      ppdVar3 = this->aDist;
      for (uVar6 = 0; uVar4 != uVar6; uVar6 = uVar6 + 1) {
        ppdVar3[uVar5][uVar6] = 0.0;
      }
    }
  }
  return (int)uVar4;
}

Assistant:

void DependanceEstimator::init()
{
	nSamples = 0;
	for(int i=0; i<dependanceBins; i++)
		aSamples[i] = 0.0;
	if(nEstimate & EST_MEAN)
		for(int i=0; i<dependanceBins; i++)
			aOne[i] = 0.0;
	if(nEstimate & EST_VAR)
		for(int i=0; i<dependanceBins; i++)
			aTwo[i] = 0.0;
	if(nEstimate & EST_CUR)
		for(int i=0; i<dependanceBins; i++)
			aThree[i] = 0.0;
	if(nEstimate & EST_DENS) {
		int distBins = int(ceil((dDistEnd - dDistBegin) / dDistDelta));
		for( int i=0; i<dependanceBins; i++ )
			for( int j=0; j<distBins; j++ )
				aDist[i][j] = 0.0;
	}
}